

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void LogWithLevels(int v,int severity,bool err,bool alsoerr)

{
  ostream *poVar1;
  SendMethod send_method;
  undefined8 in_stack_fffffffffffffae8;
  undefined8 in_stack_fffffffffffffaf0;
  bool local_4d2;
  bool local_4d1;
  bool local_4c2;
  bool local_4c1;
  bool local_442;
  bool local_441;
  bool local_42a;
  bool local_429;
  bool local_3e2;
  bool local_3e1;
  bool local_3ca;
  bool local_3c9;
  bool local_3b2;
  bool local_3b1;
  bool local_382;
  bool local_381;
  bool local_36a;
  bool local_369;
  bool local_353;
  bool local_352;
  bool local_350;
  bool local_34f;
  bool local_34d;
  bool local_34c;
  bool local_34a;
  bool local_349;
  int32 verbose_level___15;
  int32 verbose_level___14;
  LogMessage local_2e8;
  bool local_2d5;
  undefined4 local_2d4;
  code *pcStack_2d0;
  int32 verbose_level___13;
  undefined8 uStack_2c8;
  LogMessage local_2c0;
  bool local_2ad;
  undefined4 local_2ac;
  int32 verbose_level___12;
  code *local_268;
  undefined8 uStack_260;
  LogMessage local_258;
  code *local_248;
  undefined8 uStack_240;
  LogMessage local_238;
  undefined1 local_221;
  undefined1 local_209;
  byte local_1e9;
  int32 verbose_level___11;
  LogMessageVoidify local_1d2;
  byte local_1d1;
  LogMessage local_1d0;
  LogMessageVoidify local_1ba;
  byte local_1b9;
  LogMessage local_1b8;
  LogMessageVoidify local_1a2;
  bool local_1a1;
  undefined4 local_1a0;
  byte local_199;
  int32 verbose_level___10;
  LogMessageVoidify local_182;
  bool local_181;
  undefined4 local_180;
  int local_17c;
  int32 verbose_level___9;
  int c;
  LogMessageVoidify local_161;
  LogMessage local_160;
  LogMessageVoidify local_149;
  LogMessage local_148;
  LogMessageVoidify local_132;
  byte local_131;
  LogMessage local_130;
  LogMessageVoidify local_11a;
  bool local_119;
  undefined4 local_118;
  byte local_111;
  int32 verbose_level___8;
  LogMessageVoidify local_fa;
  bool local_f9;
  undefined4 local_f8;
  byte local_f1;
  int32 verbose_level___7;
  LogMessageVoidify local_de;
  bool local_dd;
  undefined4 local_dc;
  undefined1 local_d8 [4];
  int32 verbose_level___6;
  LogMessage local_c8;
  LogMessage local_b8;
  byte local_a1;
  LogMessage local_a0;
  LogMessageVoidify local_8a;
  bool local_89;
  undefined4 local_88;
  byte local_81;
  int32 verbose_level___5;
  LogMessageVoidify local_6a;
  bool local_69;
  undefined4 local_68;
  byte local_61;
  int32 verbose_level___4;
  LogMessageVoidify local_4a;
  bool local_49;
  undefined4 local_48;
  bool local_41;
  int32 verbose_level___3;
  bool local_39;
  int32 verbose_level___2;
  int32 verbose_level___1;
  bool local_25;
  undefined4 local_24;
  int32 verbose_level__;
  FlagSaver saver;
  bool alsoerr_local;
  bool err_local;
  int severity_local;
  int v_local;
  
  send_method = (SendMethod)(uint)severity;
  saver.impl_._6_1_ = alsoerr;
  saver.impl_._7_1_ = err;
  google::RawLog__(0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x171,"Test: v=%d stderrthreshold=%d logtostderr=%d alsologtostderr=%d",
                   (ulong)(uint)v,send_method,
                   CONCAT44((int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(uint)err),
                   CONCAT44((int)((ulong)in_stack_fffffffffffffaf0 >> 0x20),(uint)alsoerr));
  google::FlagSaver::FlagSaver((FlagSaver *)&stack0xffffffffffffffe0);
  fLB::FLAGS_logtostderr = saver.impl_._7_1_ & 1;
  fLB::FLAGS_alsologtostderr = saver.impl_._6_1_ & 1;
  local_24 = 0xffffffff;
  local_349 = false;
  fLI::FLAGS_stderrthreshold = severity;
  fLI::FLAGS_v = v;
  if (-2 < *LogWithLevels::vlocal__) {
    local_34a = true;
    if (LogWithLevels::vlocal__ == &google::kLogSiteUninitialized) {
      local_34a = google::InitVLOG3__(&LogWithLevels::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,-1);
    }
    local_349 = local_34a;
  }
  local_25 = local_349;
  if (local_349 != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x17a,"vlog -1");
  }
  verbose_level___2 = 0;
  local_34c = false;
  if (-1 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_34d = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_34d = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,0);
    }
    local_34c = local_34d;
  }
  local_39 = local_34c;
  if (local_34c != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x17b,"vlog 0");
  }
  verbose_level___3 = 1;
  local_34f = false;
  if (0 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_350 = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_350 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,1);
    }
    local_34f = local_350;
  }
  local_41 = local_34f;
  if (local_34f != false) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x17c,"vlog 1");
  }
  google::RawLog__(0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x17d,"log info");
  google::RawLog__(1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x17e,"log warning");
  google::RawLog__(2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x17f,"log error");
  local_48 = 0xffffffff;
  local_61 = 0;
  local_352 = false;
  if (-2 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_353 = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_353 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,-1);
    }
    local_352 = local_353;
  }
  local_49 = local_352;
  if (local_352 != false) {
    google::LogMessageVoidify::LogMessageVoidify(&local_4a);
    google::LogMessage::LogMessage
              ((LogMessage *)&verbose_level___4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x181);
    local_61 = 1;
    poVar1 = google::LogMessage::stream((LogMessage *)&verbose_level___4);
    poVar1 = std::operator<<(poVar1,"vlog -1");
    google::LogMessageVoidify::operator&(&local_4a,poVar1);
  }
  if ((local_61 & 1) != 0) {
    google::LogMessage::~LogMessage((LogMessage *)&verbose_level___4);
  }
  local_68 = 0;
  local_81 = 0;
  local_369 = false;
  if (-1 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_36a = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_36a = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,0);
    }
    local_369 = local_36a;
  }
  local_69 = local_369;
  if (local_369 != false) {
    google::LogMessageVoidify::LogMessageVoidify(&local_6a);
    google::LogMessage::LogMessage
              ((LogMessage *)&verbose_level___5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x182);
    local_81 = 1;
    poVar1 = google::LogMessage::stream((LogMessage *)&verbose_level___5);
    poVar1 = std::operator<<(poVar1,"vlog 0");
    google::LogMessageVoidify::operator&(&local_6a,poVar1);
  }
  if ((local_81 & 1) != 0) {
    google::LogMessage::~LogMessage((LogMessage *)&verbose_level___5);
  }
  local_88 = 1;
  local_a1 = 0;
  local_381 = false;
  if (0 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_382 = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_382 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,1);
    }
    local_381 = local_382;
  }
  local_89 = local_381;
  if (local_381 != false) {
    google::LogMessageVoidify::LogMessageVoidify(&local_8a);
    google::LogMessage::LogMessage
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x183);
    local_a1 = 1;
    poVar1 = google::LogMessage::stream(&local_a0);
    poVar1 = std::operator<<(poVar1,"vlog 1");
    google::LogMessageVoidify::operator&(&local_8a,poVar1);
  }
  if ((local_a1 & 1) != 0) {
    google::LogMessage::~LogMessage(&local_a0);
  }
  google::LogMessage::LogMessage
            (&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x184);
  poVar1 = google::LogMessage::stream(&local_b8);
  std::operator<<(poVar1,"log info");
  google::LogMessage::~LogMessage(&local_b8);
  google::LogMessage::LogMessage
            (&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x185,1);
  poVar1 = google::LogMessage::stream(&local_c8);
  std::operator<<(poVar1,"log warning");
  google::LogMessage::~LogMessage(&local_c8);
  google::LogMessage::LogMessage
            ((LogMessage *)local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x186,2);
  poVar1 = google::LogMessage::stream((LogMessage *)local_d8);
  std::operator<<(poVar1,"log error");
  google::LogMessage::~LogMessage((LogMessage *)local_d8);
  local_dc = 0xffffffff;
  local_f1 = 0;
  local_3b1 = false;
  if (-2 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_3b2 = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_3b2 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,-1);
    }
    local_3b1 = local_3b2;
  }
  local_dd = local_3b1;
  if (local_3b1 != false) {
    google::LogMessageVoidify::LogMessageVoidify(&local_de);
    google::LogMessage::LogMessage
              ((LogMessage *)&verbose_level___7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x188);
    local_f1 = 1;
    poVar1 = google::LogMessage::stream((LogMessage *)&verbose_level___7);
    poVar1 = std::operator<<(poVar1,"vlog_if -1");
    google::LogMessageVoidify::operator&(&local_de,poVar1);
  }
  if ((local_f1 & 1) != 0) {
    google::LogMessage::~LogMessage((LogMessage *)&verbose_level___7);
  }
  local_f8 = 0;
  local_111 = 0;
  local_3c9 = false;
  if (-1 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_3ca = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_3ca = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,0);
    }
    local_3c9 = local_3ca;
  }
  local_f9 = local_3c9;
  if (local_3c9 != false) {
    google::LogMessageVoidify::LogMessageVoidify(&local_fa);
    google::LogMessage::LogMessage
              ((LogMessage *)&verbose_level___8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x18a);
    local_111 = 1;
    poVar1 = google::LogMessage::stream((LogMessage *)&verbose_level___8);
    poVar1 = std::operator<<(poVar1,"vlog_if 0");
    google::LogMessageVoidify::operator&(&local_fa,poVar1);
  }
  if ((local_111 & 1) != 0) {
    google::LogMessage::~LogMessage((LogMessage *)&verbose_level___8);
  }
  local_118 = 1;
  local_131 = 0;
  local_3e1 = false;
  if (0 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_3e2 = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_3e2 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,1);
    }
    local_3e1 = local_3e2;
  }
  local_119 = local_3e1;
  if (local_3e1 != false) {
    google::LogMessageVoidify::LogMessageVoidify(&local_11a);
    google::LogMessage::LogMessage
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x18c);
    local_131 = 1;
    poVar1 = google::LogMessage::stream(&local_130);
    poVar1 = std::operator<<(poVar1,"vlog_if 1");
    google::LogMessageVoidify::operator&(&local_11a,poVar1);
  }
  if ((local_131 & 1) != 0) {
    google::LogMessage::~LogMessage(&local_130);
  }
  google::LogMessageVoidify::LogMessageVoidify(&local_132);
  google::LogMessage::LogMessage
            (&local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x18e);
  poVar1 = google::LogMessage::stream(&local_148);
  poVar1 = std::operator<<(poVar1,"log_if info");
  google::LogMessageVoidify::operator&(&local_132,poVar1);
  google::LogMessage::~LogMessage(&local_148);
  google::LogMessageVoidify::LogMessageVoidify(&local_149);
  google::LogMessage::LogMessage
            (&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,400,1);
  poVar1 = google::LogMessage::stream(&local_160);
  poVar1 = std::operator<<(poVar1,"log_if warning");
  google::LogMessageVoidify::operator&(&local_149,poVar1);
  google::LogMessage::~LogMessage(&local_160);
  google::LogMessageVoidify::LogMessageVoidify(&local_161);
  google::LogMessage::LogMessage
            ((LogMessage *)&verbose_level___9,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x192,2);
  poVar1 = google::LogMessage::stream((LogMessage *)&verbose_level___9);
  poVar1 = std::operator<<(poVar1,"log_if error");
  google::LogMessageVoidify::operator&(&local_161,poVar1);
  google::LogMessage::~LogMessage((LogMessage *)&verbose_level___9);
  local_17c = -1;
  local_199 = 0;
  local_180 = 100;
  local_429 = false;
  if (99 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_42a = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_42a = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,100);
    }
    local_429 = local_42a;
  }
  local_181 = local_429;
  if (local_429 == false) {
  }
  else {
    google::LogMessageVoidify::LogMessageVoidify(&local_182);
    google::LogMessage::LogMessage
              ((LogMessage *)&verbose_level___10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x196);
    local_199 = 1;
    poVar1 = google::LogMessage::stream((LogMessage *)&verbose_level___10);
    poVar1 = std::operator<<(poVar1,"vlog_if 100 expr");
    google::LogMessageVoidify::operator&(&local_182,poVar1);
  }
  if ((local_199 & 1) != 0) {
    google::LogMessage::~LogMessage((LogMessage *)&verbose_level___10);
  }
  if (local_17c != -1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","c","==","-1");
    exit(1);
  }
  local_17c = -1;
  local_1b9 = 0;
  local_1a0 = 0;
  local_441 = false;
  if (-1 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_442 = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_442 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,0);
    }
    local_441 = local_442;
  }
  local_1a1 = local_441;
  if (local_441 == false) {
  }
  else {
    google::LogMessageVoidify::LogMessageVoidify(&local_1a2);
    google::LogMessage::LogMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x197);
    local_1b9 = 1;
    poVar1 = google::LogMessage::stream(&local_1b8);
    poVar1 = std::operator<<(poVar1,"vlog_if 0 expr");
    google::LogMessageVoidify::operator&(&local_1a2,poVar1);
  }
  if ((local_1b9 & 1) != 0) {
    google::LogMessage::~LogMessage(&local_1b8);
  }
  if (local_17c != -1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","c","==","-1");
    exit(1);
  }
  local_17c = -1;
  local_1d1 = 0;
  google::LogMessageVoidify::LogMessageVoidify(&local_1ba);
  google::LogMessage::LogMessage
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x198);
  local_1d1 = 1;
  poVar1 = google::LogMessage::stream(&local_1d0);
  poVar1 = std::operator<<(poVar1,"log_if info expr");
  google::LogMessageVoidify::operator&(&local_1ba,poVar1);
  if ((local_1d1 & 1) != 0) {
    google::LogMessage::~LogMessage(&local_1d0);
  }
  if (local_17c != -1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","c","==","-1");
    exit(1);
  }
  local_17c = -1;
  local_1e9 = 0;
  google::LogMessageVoidify::LogMessageVoidify(&local_1d2);
  google::LogMessage::LogMessage
            ((LogMessage *)&verbose_level___11,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x199,2);
  local_1e9 = 1;
  poVar1 = google::LogMessage::stream((LogMessage *)&verbose_level___11);
  poVar1 = std::operator<<(poVar1,"log_if error expr");
  google::LogMessageVoidify::operator&(&local_1d2,poVar1);
  if ((local_1e9 & 1) != 0) {
    google::LogMessage::~LogMessage((LogMessage *)&verbose_level___11);
  }
  if (local_17c != -1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","c","==","-1");
    exit(1);
  }
  local_209 = 0;
  local_221 = 0;
  LogWithLevels::occurrences_413 = LogWithLevels::occurrences_413 + 1;
  local_17c = -1;
  LogWithLevels::occurrences_mod_n_413 = (LogWithLevels::occurrences_mod_n_413 + 1) % 1;
  if (LogWithLevels::occurrences_mod_n_413 == 0) {
    local_248 = google::LogMessage::SendToLog;
    uStack_240 = 0;
    local_17c = -1;
    google::LogMessage::LogMessage
              (&local_238,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x19d,0,LogWithLevels::occurrences_413,send_method);
    poVar1 = google::LogMessage::stream(&local_238);
    std::operator<<(poVar1,"log_if info every 1 expr");
    google::LogMessage::~LogMessage(&local_238);
  }
  if (local_17c != -1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","c","==","-1");
    exit(1);
  }
  LogWithLevels::occurrences_415 = LogWithLevels::occurrences_415 + 1;
  local_17c = -1;
  LogWithLevels::occurrences_mod_n_415 = (LogWithLevels::occurrences_mod_n_415 + 1) % 1;
  if (LogWithLevels::occurrences_mod_n_415 == 0) {
    local_268 = google::LogMessage::SendToLog;
    uStack_260 = 0;
    local_17c = -1;
    google::LogMessage::LogMessage
              (&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x19f,2,LogWithLevels::occurrences_415,send_method);
    poVar1 = google::LogMessage::stream(&local_258);
    std::operator<<(poVar1,"log_if error every 1 expr");
    google::LogMessage::~LogMessage(&local_258);
  }
  if (local_17c != -1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","c","==","-1");
    exit(1);
  }
  LogWithLevels::occurrences_417 = LogWithLevels::occurrences_417 + 1;
  LogWithLevels::occurrences_419 = LogWithLevels::occurrences_419 + 1;
  LogWithLevels::occurrences_421 = LogWithLevels::occurrences_421 + 1;
  local_17c = 1;
  local_2ac = 0;
  local_4c1 = false;
  if (-1 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
    local_4c2 = true;
    if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
      local_4c2 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                      ,0);
    }
    local_4c1 = local_4c2;
  }
  local_2ad = local_4c1;
  if ((local_4c1 != false) &&
     (LogWithLevels::occurrences_mod_n_421 = (LogWithLevels::occurrences_mod_n_421 + 1) % 1,
     LogWithLevels::occurrences_mod_n_421 == 0)) {
    pcStack_2d0 = google::LogMessage::SendToLog;
    uStack_2c8 = 0;
    google::LogMessage::LogMessage
              (&local_2c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x1a5,0,LogWithLevels::occurrences_421,send_method);
    poVar1 = google::LogMessage::stream(&local_2c0);
    std::operator<<(poVar1,"vlog_if 0 every 1 expr");
    google::LogMessage::~LogMessage(&local_2c0);
  }
  if (local_17c == 1) {
    LogWithLevels::occurrences_423 = LogWithLevels::occurrences_423 + 1;
    local_17c = 1;
    local_2d4 = 100;
    local_4d1 = false;
    if (99 < *LogWithLevels(int,int,bool,bool)::vlocal__) {
      local_4d2 = true;
      if (LogWithLevels(int,int,bool,bool)::vlocal__ == &google::kLogSiteUninitialized) {
        local_4d2 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                        ,100);
      }
      local_4d1 = local_4d2;
    }
    local_2d5 = local_4d1;
    if ((local_4d1 != false) &&
       (LogWithLevels::occurrences_mod_n_423 = (LogWithLevels::occurrences_mod_n_423 + 1) % 3,
       LogWithLevels::occurrences_mod_n_423 == 1)) {
      google::LogMessage::LogMessage
                (&local_2e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x1a7,0,LogWithLevels::occurrences_423,send_method);
      poVar1 = google::LogMessage::stream(&local_2e8);
      std::operator<<(poVar1,"vlog_if 100 every 3 expr");
      google::LogMessage::~LogMessage(&local_2e8);
    }
    if (local_17c != 1) {
      fprintf(_stderr,"Check failed: %s %s %s\n","c","==","1");
      exit(1);
    }
    LogWithLevels::occurrences_425 = LogWithLevels::occurrences_425 + 1;
    LogWithLevels::occurrences_427 = LogWithLevels::occurrences_427 + 1;
    local_17c = 0;
    google::FlagSaver::~FlagSaver((FlagSaver *)&stack0xffffffffffffffe0);
    return;
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","c","==","1");
  exit(1);
}

Assistant:

void LogWithLevels(int v, int severity, bool err, bool alsoerr) {
  RAW_LOG(INFO,
          "Test: v=%d stderrthreshold=%d logtostderr=%d alsologtostderr=%d",
          v, severity, err, alsoerr);

  FlagSaver saver;

  FLAGS_v = v;
  FLAGS_stderrthreshold = severity;
  FLAGS_logtostderr = err;
  FLAGS_alsologtostderr = alsoerr;

  RAW_VLOG(-1, "vlog -1");
  RAW_VLOG(0, "vlog 0");
  RAW_VLOG(1, "vlog 1");
  RAW_LOG(INFO, "log info");
  RAW_LOG(WARNING, "log warning");
  RAW_LOG(ERROR, "log error");

  VLOG(-1) << "vlog -1";
  VLOG(0) << "vlog 0";
  VLOG(1) << "vlog 1";
  LOG(INFO) << "log info";
  LOG(WARNING) << "log warning";
  LOG(ERROR) << "log error";

  VLOG_IF(-1, true) << "vlog_if -1";
  VLOG_IF(-1, false) << "don't vlog_if -1";
  VLOG_IF(0, true) << "vlog_if 0";
  VLOG_IF(0, false) << "don't vlog_if 0";
  VLOG_IF(1, true) << "vlog_if 1";
  VLOG_IF(1, false) << "don't vlog_if 1";
  LOG_IF(INFO, true) << "log_if info";
  LOG_IF(INFO, false) << "don't log_if info";
  LOG_IF(WARNING, true) << "log_if warning";
  LOG_IF(WARNING, false) << "don't log_if warning";
  LOG_IF(ERROR, true) << "log_if error";
  LOG_IF(ERROR, false) << "don't log_if error";

  int c;
  c = 1; VLOG_IF(100, c -= 2) << "vlog_if 100 expr"; EXPECT_EQ(c, -1);
  c = 1; VLOG_IF(0, c -= 2) << "vlog_if 0 expr"; EXPECT_EQ(c, -1);
  c = 1; LOG_IF(INFO, c -= 2) << "log_if info expr"; EXPECT_EQ(c, -1);
  c = 1; LOG_IF(ERROR, c -= 2) << "log_if error expr"; EXPECT_EQ(c, -1);
  c = 2; VLOG_IF(0, c -= 2) << "don't vlog_if 0 expr"; EXPECT_EQ(c, 0);
  c = 2; LOG_IF(ERROR, c -= 2) << "don't log_if error expr"; EXPECT_EQ(c, 0);

  c = 3; LOG_IF_EVERY_N(INFO, c -= 4, 1) << "log_if info every 1 expr";
  EXPECT_EQ(c, -1);
  c = 3; LOG_IF_EVERY_N(ERROR, c -= 4, 1) << "log_if error every 1 expr";
  EXPECT_EQ(c, -1);
  c = 4; LOG_IF_EVERY_N(ERROR, c -= 4, 3) << "don't log_if info every 3 expr";
  EXPECT_EQ(c, 0);
  c = 4; LOG_IF_EVERY_N(ERROR, c -= 4, 3) << "don't log_if error every 3 expr";
  EXPECT_EQ(c, 0);
  c = 5; VLOG_IF_EVERY_N(0, c -= 4, 1) << "vlog_if 0 every 1 expr";
  EXPECT_EQ(c, 1);
  c = 5; VLOG_IF_EVERY_N(100, c -= 4, 3) << "vlog_if 100 every 3 expr";
  EXPECT_EQ(c, 1);
  c = 6; VLOG_IF_EVERY_N(0, c -= 6, 1) << "don't vlog_if 0 every 1 expr";
  EXPECT_EQ(c, 0);
  c = 6; VLOG_IF_EVERY_N(100, c -= 6, 3) << "don't vlog_if 100 every 1 expr";
  EXPECT_EQ(c, 0);
}